

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

string * __thiscall
kaitai::kstream::read_bytes_term_abi_cxx11_
          (string *__return_storage_ptr__,kstream *this,char term,bool include,bool consume,
          bool eos_error)

{
  byte bVar1;
  runtime_error *this_00;
  bool eos_error_local;
  bool consume_local;
  bool include_local;
  char term_local;
  kstream *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (this->m_io,(string *)__return_storage_ptr__,term);
  bVar1 = std::ios::eof();
  if ((bVar1 & 1) == 0) {
    if (include) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    if (!consume) {
      std::istream::unget();
    }
  }
  else if (eos_error) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"read_bytes_term: encountered EOF");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string kaitai::kstream::read_bytes_term(char term, bool include, bool consume, bool eos_error) {
    std::string result;
    std::getline(*m_io, result, term);
    if (m_io->eof()) {
        // encountered EOF
        if (eos_error) {
            throw std::runtime_error("read_bytes_term: encountered EOF");
        }
    } else {
        // encountered terminator
        if (include)
            result.push_back(term);
        if (!consume)
            m_io->unget();
    }
    return result;
}